

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if2.c
# Opt level: O3

int wait_for_edge(int pi,uint user_gpio,uint edge,double timeout)

{
  uint id;
  int iVar1;
  int triggered;
  timeval tv;
  int local_4c;
  double local_48;
  double local_40;
  double local_38;
  timeval local_30;
  
  local_4c = 0;
  iVar1 = -0x7db;
  if ((((uint)pi < 0x20) && (gPiInUse[(uint)pi] != 0)) && (iVar1 = 0, 0.0 < timeout)) {
    local_38 = timeout;
    gettimeofday(&local_30,(__timezone_ptr_t)0x0);
    local_40 = (double)local_30.tv_sec;
    local_48 = (double)local_30.tv_usec;
    id = intCallback(pi,user_gpio,edge,_wfe,&local_4c,1);
    if (local_4c == 0) {
      local_48 = local_48 / 1000000.0 + local_40 + local_38;
      do {
        gettimeofday(&local_30,(__timezone_ptr_t)0x0);
        if (local_48 <= (double)local_30.tv_usec / 1000000.0 + (double)local_30.tv_sec) break;
        time_sleep(0.05);
      } while (local_4c == 0);
    }
    callback_cancel(id);
    iVar1 = local_4c;
  }
  return iVar1;
}

Assistant:

int wait_for_edge(int pi, unsigned user_gpio, unsigned edge, double timeout)
{
   int triggered = 0;
   int id;
   double due;

   if ((pi < 0) || (pi >= MAX_PI) || !gPiInUse[pi])
      return pigif_unconnected_pi;

   if (timeout <= 0.0) return 0;

   due = time_time() + timeout;

   id = callback_ex(pi, user_gpio, edge, _wfe, &triggered);

   while (!triggered && (time_time() < due)) time_sleep(0.05);

   callback_cancel(id);

   return triggered;
}